

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH8Factory::BVH8UserGeometry(BVH8Factory *this,Scene *scene,BuildVariant bvariant)

{
  bool bVar1;
  BVH8 *bvh;
  Builder *builder;
  AccelInstance *this_00;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors intersectors;
  
  bvh = (BVH8 *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&Object::type,scene);
  BVH8UserGeometryIntersectors(&intersectors,this,bvh);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"default");
  if (bVar1) {
    if (bvariant != STATIC) {
      if (bvariant != DYNAMIC) {
        builder = (Builder *)0x0;
        goto LAB_0041749f;
      }
LAB_0041748d:
      builder = (*this->BVH8BuilderTwoLevelVirtualSAH)(bvh,scene,false);
      goto LAB_0041749f;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"sah");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(scene->super_AccelN).field_0x188 + 0x330),"dynamic");
      if (!bVar1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&local_180,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
        std::operator+(&local_160,&local_180," for BVH8<Object>");
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_160);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      goto LAB_0041748d;
    }
  }
  builder = (*this->BVH8VirtualSceneBuilderSAH)(bvh,scene,0);
LAB_0041749f:
  this_00 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_00,(AccelData *)bvh,builder,&intersectors);
  return &this_00->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8UserGeometry(Scene* scene, BuildVariant bvariant)
  {
    BVH8* accel = new BVH8(Object::type,scene);
    Accel::Intersectors intersectors = BVH8UserGeometryIntersectors(accel);

    Builder* builder = nullptr;
    if (scene->device->object_builder == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH8VirtualSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH8BuilderTwoLevelVirtualSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else if (scene->device->object_builder == "sah") builder = BVH8VirtualSceneBuilderSAH(accel,scene,0);
    else if (scene->device->object_builder == "dynamic") builder = BVH8BuilderTwoLevelVirtualSAH(accel,scene,false);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->object_builder+" for BVH8<Object>");

    return new AccelInstance(accel,builder,intersectors);
  }